

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O3

string * __thiscall
vkt::synchronization::getResourceName_abi_cxx11_
          (string *__return_storage_ptr__,synchronization *this,ResourceDescription *resource)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  char *__s;
  long *plVar5;
  ostringstream str;
  allocator<char> local_3d9;
  long *local_3d8;
  long local_3d0;
  long local_3c8;
  long lStack_3c0;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  string local_398;
  string local_378;
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318;
  long local_310;
  long local_308 [12];
  ios_base local_2a8 [264];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  iVar1 = *(int *)this;
  if (iVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"image_",6);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,*(int *)(this + 4));
    iVar1 = *(int *)(this + 8);
    if (iVar1 < 1) {
      local_3b8 = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_318);
      std::ostream::operator<<(&local_318,iVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_318);
      std::ios_base::~ios_base(local_2a8);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_338,0,(char *)0x0,0xacb04d);
      local_3b8 = &local_3a8;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_3a8 = *plVar5;
        lStack_3a0 = plVar4[3];
      }
      else {
        local_3a8 = *plVar5;
        local_3b8 = (long *)*plVar4;
      }
      local_3b0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_3b8,local_3b0);
    iVar2 = *(int *)(this + 0xc);
    if (iVar2 < 1) {
      local_3d8 = &local_3c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"");
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_318);
      std::ostream::operator<<(&local_318,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_318);
      std::ios_base::~ios_base(local_2a8);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_358,0,(char *)0x0,0xacb04d);
      local_3d8 = &local_3c8;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_3c8 = *plVar5;
        lStack_3c0 = plVar4[3];
      }
      else {
        local_3c8 = *plVar5;
        local_3d8 = (long *)*plVar4;
      }
      local_3d0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_3d8,local_3d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    __s = ::vk::getFormatName(*(VkFormat *)(this + 0x18));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,__s,&local_3d9);
    de::toLower(&local_378,&local_398);
    std::__cxx11::string::substr((ulong)&local_318,(ulong)&local_378);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_318,local_310);
    if (local_318 != local_308) {
      operator_delete(local_318,local_308[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if (local_3d8 != &local_3c8) {
      operator_delete(local_3d8,local_3c8 + 1);
    }
    if ((0 < iVar2) && (local_358[0] != local_348)) {
      operator_delete(local_358[0],local_348[0] + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,local_3a8 + 1);
    }
    if ((0 < iVar1) && (local_338[0] != local_328)) {
      operator_delete(local_338[0],local_328[0] + 1);
    }
  }
  else if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"buffer_",7);
    std::ostream::operator<<(local_1a0,*(int *)(this + 4));
  }
  else if (iVar1 - 2U < 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"indirect_buffer",0xf);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string getResourceName (const ResourceDescription& resource)
{
	std::ostringstream str;

	if (resource.type == RESOURCE_TYPE_BUFFER)
		str << "buffer_" << resource.size.x();
	else if (resource.type == RESOURCE_TYPE_IMAGE)
	{
		str << "image_" << resource.size.x()
						<< (resource.size.y() > 0 ? "x" + de::toString(resource.size.y()) : "")
						<< (resource.size.z() > 0 ? "x" + de::toString(resource.size.z()) : "")
			<< "_" << de::toLower(getFormatName(resource.imageFormat)).substr(10);
	}
	else if (isIndirectBuffer(resource.type))
		str << "indirect_buffer";
	else
		DE_ASSERT(0);

	return str.str();
}